

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

size_t __thiscall Assimp::CFIReaderImpl::parseSequenceLen(CFIReaderImpl *this)

{
  byte bVar1;
  byte *pbVar2;
  DeadlyImportError *this_00;
  size_t result;
  uint8_t b;
  CFIReaderImpl *this_local;
  
  if ((long)this->dataEnd - (long)this->dataP < 1) {
LAB_00ab6f9b:
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    DeadlyImportError::DeadlyImportError(this_00,(string *)parseErrorMessage_abi_cxx11_);
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  pbVar2 = this->dataP;
  this->dataP = pbVar2 + 1;
  bVar1 = *pbVar2;
  if (bVar1 < 0x80) {
    this_local = (CFIReaderImpl *)(ulong)bVar1;
  }
  else {
    if (((bVar1 & 0xf0) != 0x80) || ((long)this->dataEnd - (long)this->dataP < 2))
    goto LAB_00ab6f9b;
    this_local = (CFIReaderImpl *)
                 (long)(int)(((bVar1 & 0xf) << 0x10 | (uint)*this->dataP << 8 | (uint)this->dataP[1]
                             ) + 0x80);
    this->dataP = this->dataP + 2;
  }
  return (size_t)this_local;
}

Assistant:

size_t parseSequenceLen() { // C.21
        if (dataEnd - dataP > 0) {
            uint8_t b = *dataP++;
            if (b < 0x80) { // 0....... (C.21.2)
                return b;
            }
            else if ((b & 0xf0) == 0x80) { // 1000.... ........ ........ (C.21.3)
                if (dataEnd - dataP > 1) {
                    size_t result = (((b & 0x0f) << 16) | (dataP[0] << 8) | dataP[1]) + 0x80;
                    dataP += 2;
                    return result;
                }
            }
        }
        throw DeadlyImportError(parseErrorMessage);
    }